

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_Model::Read(ONX_Model *this,wchar_t *filename,uint table_filter,uint model_object_type_filter,
               ON_TextLog *error_log)

{
  bool bVar1;
  undefined1 local_268 [8];
  ON_BinaryFile file;
  FILE *fp;
  bool rc;
  bool bCallReset;
  ON_TextLog *error_log_local;
  uint model_object_type_filter_local;
  uint table_filter_local;
  wchar_t *filename_local;
  ONX_Model *this_local;
  
  fp._7_1_ = true;
  fp._6_1_ = false;
  if (filename != (wchar_t *)0x0) {
    file.m_memory_buffer = (uchar *)ON::OpenFile(filename,L"rb");
    bVar1 = (FILE *)file.m_memory_buffer != (FILE *)0x0;
    if (bVar1) {
      ON_BinaryFile::ON_BinaryFile((ON_BinaryFile *)local_268,read3dm,(FILE *)file.m_memory_buffer);
      fp._6_1_ = Read(this,(ON_BinaryArchive *)local_268,table_filter,model_object_type_filter,
                      error_log);
      ON::CloseFile((FILE *)file.m_memory_buffer);
      ON_BinaryFile::~ON_BinaryFile((ON_BinaryFile *)local_268);
    }
    fp._7_1_ = !bVar1;
  }
  if (fp._7_1_) {
    Reset(this);
  }
  return fp._6_1_;
}

Assistant:

bool ONX_Model::Read( 
    const wchar_t* filename,
    unsigned int table_filter,
    unsigned int model_object_type_filter,
    ON_TextLog* error_log
    )
{
  bool bCallReset = true;
  bool rc = false;

  if ( 0 != filename )
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( 0 != fp )
    {
      bCallReset = false;
      ON_BinaryFile file(ON::archive_mode::read3dm,fp);
      rc = Read(file, table_filter, model_object_type_filter, error_log);
      ON::CloseFile(fp);
    }
  }

  if ( bCallReset )
    Reset();

  return rc;
}